

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O3

int tcv_get_rx_pwr(tcv_t *tcv,uint16_t *pwr)

{
  _func_int_tcv_t_ptr_uint16_t_ptr *p_Var1;
  int iVar2;
  int iVar3;
  
  iVar3 = -4;
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    if ((pwr != (uint16_t *)0x0) && (iVar2 == 0)) {
      p_Var1 = tcv->fun->get_rx_pwr;
      if (p_Var1 == (_func_int_tcv_t_ptr_uint16_t_ptr *)0x0) {
        iVar3 = -0xc;
      }
      else {
        iVar3 = (*p_Var1)(tcv,pwr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
    }
  }
  return iVar3;
}

Assistant:

int tcv_get_rx_pwr(tcv_t* tcv, uint16_t* pwr)
{
	/* Not all have Digital diagnostics */
	int ret = TCV_ERR_FEATURE_NOT_AVAILABLE;

	if (!tcv_check_and_lock_ok(tcv) || !pwr)
		return TCV_ERR_INVALID_ARG;

	if (tcv->fun->get_rx_pwr)
		ret = tcv->fun->get_rx_pwr(tcv, pwr);

	tcv_unlock(tcv);
	return ret;
}